

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QString * __thiscall
QFileDialog::labelText(QString *__return_storage_ptr__,QFileDialog *this,DialogLabel label)

{
  long lVar1;
  long lVar2;
  int iVar3;
  QPushButton *this_00;
  StandardButton which;
  QLabel *this_01;
  QDialogButtonBox *this_02;
  QFileDialogPrivate *d;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x370);
  if ((lVar2 == 0 | *(byte *)(lVar1 + 0x2c8)) == 1) {
    QFileDialogOptions::labelText((DialogLabel)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  switch(label) {
  case LookIn:
    this_01 = *(QLabel **)(lVar2 + 8);
    break;
  case FileName:
    this_01 = *(QLabel **)(lVar2 + 0xa8);
    break;
  case FileType:
    this_01 = *(QLabel **)(lVar2 + 0xc0);
    break;
  case Accept:
    iVar3 = QFileDialogOptions::acceptMode();
    this_02 = *(QDialogButtonBox **)(*(long *)(lVar1 + 0x370) + 0xb8);
    which = Save;
    if (iVar3 == 0) {
      which = Open;
    }
    goto LAB_004ee70a;
  case Reject:
    this_02 = *(QDialogButtonBox **)(lVar2 + 0xb8);
    which = Cancel;
LAB_004ee70a:
    this_00 = QDialogButtonBox::button(this_02,which);
    if (this_00 != (QPushButton *)0x0) {
      QAbstractButton::text(__return_storage_ptr__,&this_00->super_QAbstractButton);
      return __return_storage_ptr__;
    }
switchD_004ee6c1_default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  default:
    goto switchD_004ee6c1_default;
  }
  QLabel::text(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

QString QFileDialog::labelText(DialogLabel label) const
{
    Q_D(const QFileDialog);
    if (!d->usingWidgets())
        return d->options->labelText(static_cast<QFileDialogOptions::DialogLabel>(label));
    QPushButton *button;
    switch (label) {
    case LookIn:
        return d->qFileDialogUi->lookInLabel->text();
    case FileName:
        return d->qFileDialogUi->fileNameLabel->text();
    case FileType:
        return d->qFileDialogUi->fileTypeLabel->text();
    case Accept:
        if (acceptMode() == AcceptOpen)
            button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Open);
        else
            button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Save);
        if (button)
            return button->text();
        break;
    case Reject:
        button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Cancel);
        if (button)
            return button->text();
        break;
    }
    return QString();
}